

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

IdentPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PidAt
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,size_t iecpMin,size_t iecpLim)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined4 *puVar4;
  IdentPtr pIVar5;
  size_t iecpLim_local;
  size_t iecpMin_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  sVar3 = AdjustedLength(this);
  if (iecpMin < sVar3) {
    sVar3 = AdjustedLength(this);
    if ((iecpLim <= sVar3) && (iecpMin < iecpLim)) goto LAB_015efeeb;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                     ,0x21f,
                     "(iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin)"
                     ,
                     "iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_015efeeb:
  pIVar5 = PidOfIdentiferAt(this,this->m_pchBase + iecpMin,this->m_pchBase + iecpLim);
  return pIVar5;
}

Assistant:

IdentPtr Scanner<EncodingPolicy>::PidAt(size_t iecpMin, size_t iecpLim)
{
    Assert(iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin);
    return PidOfIdentiferAt(m_pchBase + iecpMin, m_pchBase + iecpLim);
}